

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O2

size_t __thiscall
Common::
SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator[](SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  size_t sVar1;
  SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar2;
  
  sVar1 = findKey(this,key);
  if (sVar1 == (long)(this->data).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->data).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) {
    pSVar2 = (SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur == pSVar2) {
      pSVar2 = this;
    }
    sVar1 = pSVar2->currcount;
    insert(this,key);
  }
  return sVar1;
}

Assistant:

size_t operator[](const _KTy &key) {
		size_t id = findKey(key);
		if (id == size()) {
			id = currentIndex();
			insert(key);
		}
		return id;
	}